

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

bool simdTestMask(char **ptr,char *end,quint32 maskval)

{
  undefined1 (*pauVar1) [16];
  uint uVar2;
  undefined1 (*pauVar3) [16];
  uint uVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar6._4_4_ = maskval;
  auVar6._0_4_ = maskval;
  auVar6._8_4_ = maskval;
  auVar6._12_4_ = maskval;
  pauVar3 = (undefined1 (*) [16])*ptr;
  while (pauVar1 = pauVar3 + 1, pauVar1 <= end) {
    auVar8 = *pauVar3 & auVar6;
    auVar9._0_2_ = -(ushort)(auVar8._0_2_ == 0);
    auVar9._2_2_ = -(ushort)(auVar8._2_2_ == 0);
    auVar9._4_2_ = -(ushort)(auVar8._4_2_ == 0);
    auVar9._6_2_ = -(ushort)(auVar8._6_2_ == 0);
    auVar9._8_2_ = -(ushort)(auVar8._8_2_ == 0);
    auVar9._10_2_ = -(ushort)(auVar8._10_2_ == 0);
    auVar9._12_2_ = -(ushort)(auVar8._12_2_ == 0);
    auVar9._14_2_ = -(ushort)(auVar8._14_2_ == 0);
    uVar4 = (uint)(ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                           (ushort)((byte)(auVar9._14_2_ >> 7) & 1) << 0xe | auVar9._14_2_ & 0x8000)
    ;
    uVar2 = 0;
    if (~uVar4 != 0) {
      for (; (~uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    pauVar3 = (undefined1 (*) [16])(*pauVar3 + uVar2);
    if (uVar4 == 0xffff) {
      pauVar3 = pauVar1;
    }
    *ptr = (char *)pauVar3;
    if (uVar4 != 0xffff) {
      return false;
    }
  }
  if (end < *pauVar3 + 8) {
    return true;
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)*pauVar3;
  auVar7 = auVar7 & auVar6;
  auVar8._0_2_ = -(ushort)(auVar7._0_2_ == 0);
  auVar8._2_2_ = -(ushort)(auVar7._2_2_ == 0);
  auVar8._4_2_ = -(ushort)(auVar7._4_2_ == 0);
  auVar8._6_2_ = -(ushort)(auVar7._6_2_ == 0);
  auVar8._8_2_ = -(ushort)(auVar7._8_2_ == 0);
  auVar8._10_2_ = -(ushort)(auVar7._10_2_ == 0);
  auVar8._12_2_ = -(ushort)(auVar7._12_2_ == 0);
  auVar8._14_2_ = -(ushort)(auVar7._14_2_ == 0);
  uVar4 = (uint)(ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7);
  uVar2 = 0;
  if (~uVar4 != 0) {
    for (; (~uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
    }
  }
  pcVar5 = *pauVar3 + uVar2;
  if (uVar4 == 0xff) {
    pcVar5 = *pauVar3 + 8;
  }
  *ptr = pcVar5;
  if (uVar4 != 0xff) {
    return false;
  }
  return true;
}

Assistant:

static bool simdTestMask(const char *&ptr, const char *end, quint32 maskval)
{
    auto updatePtr = [&](uint result) {
        // found a character matching the mask
        uint idx = qCountTrailingZeroBits(~result);
        ptr += idx;
        return false;
    };

    if constexpr (UseSse4_1) {
#  ifndef Q_OS_QNX              // compiler fails in the code below
        __m128i mask;
        auto updatePtrSimd = [&](__m128i data) -> bool {
            __m128i masked = _mm_and_si128(mask, data);
            __m128i comparison = _mm_cmpeq_epi16(masked, _mm_setzero_si128());
            uint result = _mm_movemask_epi8(comparison);
            return updatePtr(result);
        };

        if constexpr (UseAvx2) {
            // AVX2 implementation: test 32 bytes at a time
            const __m256i mask256 = _mm256_broadcastd_epi32(_mm_cvtsi32_si128(maskval));
            while (ptr + 32 <= end) {
                __m256i data = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(ptr));
                if (!_mm256_testz_si256(mask256, data)) {
                    // found a character matching the mask
                    __m256i masked256 = _mm256_and_si256(mask256, data);
                    __m256i comparison256 = _mm256_cmpeq_epi16(masked256, _mm256_setzero_si256());
                    return updatePtr(_mm256_movemask_epi8(comparison256));
                }
                ptr += 32;
            }

            mask = _mm256_castsi256_si128(mask256);
        } else {
            // SSE 4.1 implementation: test 32 bytes at a time (two 16-byte
            // comparisons, unrolled)
            mask = _mm_set1_epi32(maskval);
            while (ptr + 32 <= end) {
                __m128i data1 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(ptr));
                __m128i data2 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(ptr + 16));
                if (!_mm_testz_si128(mask, data1))
                    return updatePtrSimd(data1);

                ptr += 16;
                if (!_mm_testz_si128(mask, data2))
                    return updatePtrSimd(data2);
                ptr += 16;
            }
        }

        // AVX2 and SSE4.1: final 16-byte comparison
        if (ptr + 16 <= end) {
            __m128i data1 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(ptr));
            if (!_mm_testz_si128(mask, data1))
                return updatePtrSimd(data1);
            ptr += 16;
        }

        // and final 8-byte comparison
        if (ptr + 8 <= end) {
            __m128i data1 = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(ptr));
            if (!_mm_testz_si128(mask, data1))
                return updatePtrSimd(data1);
            ptr += 8;
        }

        return true;
#  endif // QNX
    }

    // SSE2 implementation: test 16 bytes at a time.
    const __m128i mask = _mm_set1_epi32(maskval);
    while (ptr + 16 <= end) {
        __m128i data = _mm_loadu_si128(reinterpret_cast<const __m128i *>(ptr));
        __m128i masked = _mm_and_si128(mask, data);
        __m128i comparison = _mm_cmpeq_epi16(masked, _mm_setzero_si128());
        quint16 result = _mm_movemask_epi8(comparison);
        if (result != 0xffff)
            return updatePtr(result);
        ptr += 16;
    }

    // and one 8-byte comparison
    if (ptr + 8 <= end) {
        __m128i data = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(ptr));
        __m128i masked = _mm_and_si128(mask, data);
        __m128i comparison = _mm_cmpeq_epi16(masked, _mm_setzero_si128());
        quint8 result = _mm_movemask_epi8(comparison);
        if (result != 0xff)
            return updatePtr(result);
        ptr += 8;
    }

    return true;
}